

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall
QWidgetWindow::handleDragEnterEvent(QWidgetWindow *this,QDragMoveEvent *event,QWidget *widget)

{
  Data *pDVar1;
  bool bVar2;
  Data *pDVar3;
  long lVar4;
  undefined8 *puVar5;
  QPoint *pQVar6;
  QObject *pQVar7;
  long in_FS_OFFSET;
  byte bVar8;
  double dVar9;
  QDragEnterEvent translated;
  QPoint mapped;
  QPoint local_88;
  undefined1 local_7c;
  QPoint local_38;
  QPoint local_30;
  long local_28;
  
  bVar8 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    dVar9 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
            *(double *)(event + 0x10);
    bVar2 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    local_88.xp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar9);
    dVar9 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
            *(double *)(event + 0x18);
    bVar2 = 2147483647.0 < dVar9;
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    local_88.yp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar9);
    widget = findDnDTarget((QWidget *)(this->m_widget).wp.value,&local_88);
    if (widget == (QWidget *)0x0) {
      event[0xc] = (QDragMoveEvent)0x0;
      goto LAB_0032320a;
    }
  }
  pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
  pDVar1 = (this->m_dragTarget).wp.d;
  (this->m_dragTarget).wp.d = pDVar3;
  (this->m_dragTarget).wp.value = &widget->super_QObject;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar1 = *(int *)pDVar1 + -1;
    UNLOCK();
    if (*(int *)pDVar1 == 0) {
      operator_delete(pDVar1);
    }
  }
  local_30 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  dVar9 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(event + 0x10);
  bVar2 = 2147483647.0 < dVar9;
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  local_38.xp.m_i =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar9);
  dVar9 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
          *(double *)(event + 0x18);
  bVar2 = 2147483647.0 < dVar9;
  if (dVar9 <= -2147483648.0) {
    dVar9 = -2147483648.0;
  }
  local_38.yp.m_i =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar9);
  local_88 = QWidget::mapToGlobal((QWidget *)(this->m_widget).wp.value,&local_38);
  local_30 = QWidget::mapFromGlobal(widget,&local_88);
  puVar5 = &DAT_00666668;
  pQVar6 = &local_88;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    *pQVar6 = (QPoint)*puVar5;
    puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
    pQVar6 = pQVar6 + (ulong)bVar8 * -2 + 1;
  }
  QDragEnterEvent::QDragEnterEvent
            ((QDragEnterEvent *)&local_88,&local_30,*(undefined4 *)(event + 0x28),
             *(undefined8 *)(event + 0x38),*(undefined4 *)(event + 0x20),
             *(undefined4 *)(event + 0x24));
  pDVar1 = (this->m_dragTarget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar7 = (QObject *)0x0;
  }
  else {
    pQVar7 = (this->m_dragTarget).wp.value;
  }
  QCoreApplication::forwardEvent(pQVar7,(QEvent *)&local_88,(QEvent *)event);
  (**(code **)(*(long *)event + 0x10))(event,local_7c);
  QDropEvent::setDropAction((DropAction)event);
  QDragEnterEvent::~QDragEnterEvent((QDragEnterEvent *)&local_88);
LAB_0032320a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::handleDragEnterEvent(QDragMoveEvent *event, QWidget *widget)
{
    Q_ASSERT(m_dragTarget == nullptr);
    if (!widget)
        widget = findDnDTarget(m_widget, event->position().toPoint());
    if (!widget) {
        event->ignore();
        return;
    }
    m_dragTarget = widget;

    const QPoint mapped = widget->mapFromGlobal(m_widget->mapToGlobal(event->position().toPoint()));
    QDragEnterEvent translated(mapped, event->possibleActions(), event->mimeData(),
                               event->buttons(), event->modifiers());
    QGuiApplication::forwardEvent(m_dragTarget, &translated, event);
    event->setAccepted(translated.isAccepted());
    event->setDropAction(translated.dropAction());
}